

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O2

void google::protobuf::compiler::java::WriteMethodDocComment
               (Printer *printer,MethodDescriptor *method)

{
  bool bVar1;
  string sStack_a8;
  undefined1 local_88 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  string local_38;
  
  MethodDescriptor::DebugString_abi_cxx11_(&local_38,method);
  FirstLineOf(&sStack_a8,&local_38);
  EscapeJavadoc((string *)local_88,&sStack_a8);
  io::Printer::Print(printer,"/**\n * <code>$def$</code>\n","def",(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&sStack_a8);
  std::__cxx11::string::~string((string *)&local_38);
  local_88._16_8_ = &local_68;
  local_88._24_8_ = 0;
  local_68._M_local_buf[0] = '\0';
  local_58._M_p = (pointer)&local_48;
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  bVar1 = MethodDescriptor::GetSourceLocation(method,(SourceLocation *)local_88);
  if (bVar1) {
    WriteDocCommentBodyForLocation(printer,(SourceLocation *)local_88);
  }
  SourceLocation::~SourceLocation((SourceLocation *)local_88);
  io::Printer::Print(printer," */\n");
  return;
}

Assistant:

void WriteMethodDocComment(io::Printer* printer,
                           const MethodDescriptor* method) {
  printer->Print(
    "/**\n"
    " * <code>$def$</code>\n",
    "def", EscapeJavadoc(FirstLineOf(method->DebugString())));
  WriteDocCommentBody(printer, method);
  printer->Print(" */\n");
}